

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffGetSlot
          (NodeDiffComputer *this,GetSlotExpr *lhs,GetSlotExpr *rhs)

{
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  Node *rhs_00;
  SlotAccessExpr *in_RDX;
  SlotAccessExpr *in_RSI;
  Node *in_RDI;
  int32_t keyDiff;
  int32_t receiverDiff;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int32_t local_4;
  
  rhs_00 = &AccessExpr::receiver(&in_RSI->super_AccessExpr)->super_Node;
  AccessExpr::receiver(&in_RDX->super_AccessExpr);
  iVar3 = diffNodes((NodeDiffComputer *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI,rhs_00);
  local_4 = iVar3;
  if (iVar3 <= in_RDI[1]._coordinates.columnStart) {
    SlotAccessExpr::key(in_RSI);
    SlotAccessExpr::key(in_RDX);
    local_4 = diffNodes((NodeDiffComputer *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),in_RDI,rhs_00)
    ;
    if (local_4 <= in_RDI[1]._coordinates.columnStart) {
      bVar1 = AccessExpr::isNullable(&in_RSI->super_AccessExpr);
      bVar2 = AccessExpr::isNullable(&in_RDX->super_AccessExpr);
      if (bVar1 != bVar2) {
        iVar3 = in_RDI[1]._coordinates.lineStart + iVar3;
      }
      local_4 = iVar3 + local_4;
    }
  }
  return local_4;
}

Assistant:

int32_t diffGetSlot(const GetSlotExpr *lhs, const GetSlotExpr *rhs) {
    int32_t receiverDiff = diffNodes(lhs->receiver(), rhs->receiver());

    if (receiverDiff > limit)
      return receiverDiff;

    int32_t keyDiff = diffNodes(lhs->key(), rhs->key());

    if (keyDiff > limit)
      return keyDiff;

    if (lhs->isNullable() != rhs->isNullable())
      receiverDiff += DiffCosts.NullabilityDiffCost;

    return receiverDiff + keyDiff;
  }